

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O1

void nukedopll_update(void *chipptr,UINT32 samples,DEV_SMPL **out)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int32_t buffer [2];
  int local_50;
  int local_4c;
  ulong local_48;
  DEV_SMPL **local_40;
  ulong local_38;
  
  if (samples != 0) {
    local_48 = (ulong)samples;
    local_38 = 0;
    local_40 = out;
    do {
      iVar11 = *(int *)((long)chipptr + 0x1d0);
      iVar7 = *(int *)((long)chipptr + 0x1d4);
      while (iVar11 <= iVar7) {
        *(undefined8 *)((long)chipptr + 0x1d8) = *(undefined8 *)((long)chipptr + 0x1e0);
        *(undefined8 *)((long)chipptr + 0x1e0) = 0;
        iVar11 = 0;
        do {
          iVar12 = 0;
          iVar7 = 0;
          switch(*(undefined4 *)((long)chipptr + 0x14)) {
          case 1:
            iVar12 = *(int *)((long)chipptr + 0x1b0);
            iVar7 = *(int *)((long)chipptr + 0x1bc);
            goto switchD_00129d4c_caseD_c;
          case 2:
            iVar12 = *(int *)((long)chipptr + 0x1b4);
            iVar7 = *(int *)((long)chipptr + 0x1c0);
            goto switchD_00129d4c_caseD_c;
          case 3:
            iVar12 = *(int *)((long)chipptr + 0x1b8);
            iVar7 = *(int *)((long)chipptr + 0x1c8);
            goto switchD_00129d4c_caseD_c;
          case 4:
          case 0x11:
            iVar7 = *(int *)((long)chipptr + 0x1cc);
            goto LAB_00129de8;
          default:
            iVar7 = *(int *)((long)chipptr + 0x1c4);
            goto LAB_00129de8;
          case 6:
            iVar7 = *(int *)((long)chipptr + 0x1bc);
            goto LAB_00129de8;
          case 7:
            iVar12 = *(int *)((long)chipptr + 0x198);
            break;
          case 8:
            iVar12 = *(int *)((long)chipptr + 0x19c);
            break;
          case 9:
            iVar12 = *(int *)((long)chipptr + 0x1a0);
            break;
          case 10:
            iVar7 = *(int *)((long)chipptr + 0x1c0);
            goto LAB_00129de8;
          case 0xb:
            iVar7 = *(int *)((long)chipptr + 0x1c8);
LAB_00129de8:
            iVar12 = 0;
          case 0xc:
          case 0x10:
            goto switchD_00129d4c_caseD_c;
          case 0xd:
            iVar12 = *(int *)((long)chipptr + 0x1a4);
            break;
          case 0xe:
            iVar12 = *(int *)((long)chipptr + 0x1a8);
            break;
          case 0xf:
            iVar12 = *(int *)((long)chipptr + 0x1ac);
          }
          iVar7 = 0;
switchD_00129d4c_caseD_c:
          NOPLL_Clock((opll_t *)chipptr,&local_50);
          if (iVar12 == 0) {
            *(int *)((long)chipptr + 0x1e0) = *(int *)((long)chipptr + 0x1e0) + local_50;
          }
          if (iVar7 == 0) {
            *(int *)((long)chipptr + 0x1e4) = *(int *)((long)chipptr + 0x1e4) + local_4c;
          }
          uVar5 = *(ulong *)((long)chipptr + 0x1e8);
          uVar9 = (ulong)*(uint *)((long)chipptr + 0x1f0);
          uVar10 = uVar9 * 0x10;
          uVar6 = *(ulong *)((long)chipptr + uVar10 + 0x200);
          while ((uVar6 <= uVar5 &&
                 (bVar1 = *(byte *)((long)chipptr + uVar10 + 0x208), (bVar1 & 4) != 0))) {
            *(byte *)((long)chipptr + uVar10 + 0x208) = bVar1 & 3;
            *(undefined1 *)((long)chipptr + 0x28) = *(undefined1 *)((long)chipptr + uVar10 + 0x209);
            if ((bVar1 & 1) == 0) {
              *(byte *)((long)chipptr + 0x29) = *(byte *)((long)chipptr + 0x29) | 1;
            }
            else {
              *(byte *)((long)chipptr + 0x2a) = *(byte *)((long)chipptr + 0x2a) | 1;
            }
            uVar8 = (int)uVar9 + 1U & 0x7ff;
            uVar9 = (ulong)uVar8;
            *(uint *)((long)chipptr + 0x1f0) = uVar8;
            uVar10 = (ulong)(uVar8 << 4);
            uVar6 = *(ulong *)((long)chipptr + uVar10 + 0x200);
          }
          *(ulong *)((long)chipptr + 0x1e8) = uVar5 + 1;
          iVar11 = iVar11 + 1;
        } while (iVar11 != 0x12);
        iVar11 = *(int *)((long)chipptr + 0x1e0) * 8 + *(int *)((long)chipptr + 0x1e4) * 8;
        *(int *)((long)chipptr + 0x1e0) = iVar11;
        *(int *)((long)chipptr + 0x1e4) = iVar11;
        iVar11 = *(int *)((long)chipptr + 0x1d0);
        iVar7 = *(int *)((long)chipptr + 0x1d4) - iVar11;
        *(int *)((long)chipptr + 0x1d4) = iVar7;
      }
      iVar12 = *(int *)((long)chipptr + 0x1d0);
      iVar2 = *(int *)((long)chipptr + 0x1d4);
      iVar3 = *(int *)((long)chipptr + 0x1dc);
      iVar4 = *(int *)((long)chipptr + 0x1e4);
      *(int *)((long)chipptr + 0x1d4) = iVar2 + 0x400;
      (*local_40)[local_38] =
           (iVar7 * *(int *)((long)chipptr + 0x1e0) +
           (iVar11 - iVar7) * *(int *)((long)chipptr + 0x1d8)) / iVar11;
      local_40[1][local_38] = (iVar4 * iVar2 + (iVar12 - iVar2) * iVar3) / iVar12;
      local_38 = local_38 + 1;
    } while (local_38 != local_48);
  }
  return;
}

Assistant:

static void nukedopll_update(void *chipptr, UINT32 samples, DEV_SMPL **out)
{
	opll_t *chip = (opll_t *)chipptr;
	int32_t buffer[2];
	UINT32 i;
	
	for (i = 0; i < samples; i ++)
	{
		OPLL_GenerateResampled(chip, buffer);
		out[0][i] = buffer[0];
		out[1][i] = buffer[1];
	}
	
	return;
}